

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O3

void If_CutPrint(If_Cut_t *pCut)

{
  char *pcVar1;
  ulong uVar2;
  
  Abc_Print(1,"{");
  if (0xffffff < *(uint *)&pCut->field_0x1c) {
    uVar2 = 0;
    do {
      pcVar1 = "!";
      if (((uint)pCut->uMaskFunc >> ((uint)uVar2 & 0x1f) & 1) == 0) {
        pcVar1 = "";
      }
      Abc_Print(1," %s%d",pcVar1,(ulong)(uint)(&pCut[1].Area)[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < (byte)pCut->field_0x1f);
  }
  Abc_Print(1," }\n");
  return;
}

Assistant:

void If_CutPrint( If_Cut_t * pCut )
{
    unsigned i;
    Abc_Print( 1, "{" );
    for ( i = 0; i < pCut->nLeaves; i++ )
        Abc_Print( 1, " %s%d", If_CutLeafBit(pCut, i) ? "!":"", pCut->pLeaves[i] );
    Abc_Print( 1, " }\n" );
}